

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_test.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  RequestBuilder *pRVar1;
  Client client;
  undefined1 local_c0 [16];
  Worker *local_b0;
  string local_a8;
  string local_88;
  string local_68;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  restincurl::Client::Client((Client *)(local_c0 + 8),true);
  restincurl::Client::Build((Client *)local_c0);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"http://localhost:3001/normal/posts","");
  pRVar1 = restincurl::RequestBuilder::Prepare((RequestBuilder *)local_c0._0_8_,GET,&local_68);
  pRVar1 = restincurl::RequestBuilder::Header(pRVar1,"Accept: Application/json");
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"X-Client","");
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"restincurl","");
  pRVar1 = restincurl::RequestBuilder::Header(pRVar1,&local_88,&local_a8);
  pRVar1 = restincurl::RequestBuilder::Trace(pRVar1,true);
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<void_(const_restincurl::Result_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/tests/app_test.cpp:23:25)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(const_restincurl::Result_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/tests/app_test.cpp:23:25)>
             ::_M_manager;
  pRVar1 = restincurl::RequestBuilder::WithCompletion(pRVar1,(completion_fn_t *)&local_48);
  restincurl::RequestBuilder::Execute(pRVar1);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  std::unique_ptr<restincurl::RequestBuilder,_std::default_delete<restincurl::RequestBuilder>_>::
  ~unique_ptr((unique_ptr<restincurl::RequestBuilder,_std::default_delete<restincurl::RequestBuilder>_>
               *)local_c0);
  restincurl::Worker::CloseWhenFinished(local_b0);
  restincurl::Worker::Join(local_b0);
  restincurl::Client::~Client((Client *)(local_c0 + 8));
  return 0;
}

Assistant:

int main( int argc, char * argv[]) {

    restincurl::Client client;

    client.Build()->Get("http://localhost:3001/normal/posts")
        .AcceptJson()
        .Header("X-Client", "restincurl")
        .Trace()
        .WithCompletion([&](const Result& result) {
            clog << "In callback! HTTP result code was " << result.http_response_code << endl;
            clog << "Data was " << result.body.size() << " bytes." << endl;
        })
        .Execute();

    // If the client goes out of scope, it will terminate all ongoing
    // requests, so we need to wait here for the request to finish.

    // Tell client that we want to close when the request is finish
    client.CloseWhenFinished();

    // Wait for the worker-thread in the client to quit
    client.WaitForFinish();
}